

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-gear.c
# Opt level: O1

wchar_t slot_by_type(player *p,wchar_t type,_Bool full)

{
  ushort uVar1;
  wchar_t wVar2;
  ulong uVar3;
  wchar_t wVar4;
  ulong uVar5;
  object **ppoVar6;
  
  uVar1 = (p->body).count;
  wVar4 = (wchar_t)uVar1;
  if (uVar1 == 0) {
    uVar5 = 0;
    wVar2 = wVar4;
  }
  else {
    ppoVar6 = &((p->body).slots)->obj;
    uVar5 = 0;
    uVar3 = (ulong)(uint)wVar4;
    do {
      if ((uint)*(ushort *)(ppoVar6 + -2) == type) {
        wVar2 = (wchar_t)uVar3;
        if (*ppoVar6 == (object *)0x0) goto LAB_001961c2;
        if ((wchar_t)uVar3 == wVar4) {
          uVar3 = uVar5 & 0xffffffff;
        }
      }
      uVar5 = uVar5 + 1;
      ppoVar6 = ppoVar6 + 4;
    } while ((uint)wVar4 != uVar5);
    uVar5 = (ulong)(uint)wVar4;
    wVar2 = (wchar_t)uVar3;
  }
LAB_001961c2:
  if ((wchar_t)uVar5 != wVar4) {
    wVar2 = (wchar_t)uVar5;
  }
  return wVar2;
}

Assistant:

static int slot_by_type(struct player *p, int type, bool full)
{
	int i, fallback = p->body.count;

	/* Look for a correct slot type */
	for (i = 0; i < p->body.count; i++) {
		if (type == p->body.slots[i].type) {
			if (full) {
				/* Found a full slot */
				if (p->body.slots[i].obj != NULL) break;
			} else {
				/* Found an empty slot */
				if (p->body.slots[i].obj == NULL) break;
			}
			/* Not right for full/empty, but still the right type */
			if (fallback == p->body.count)
				fallback = i;
		}
	}

	/* Index for the best slot we found, or p->body.count if none found  */
	return (i != p->body.count) ? i : fallback;
}